

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall wallet::CWallet::CanGetAddresses(CWallet *this,bool internal)

{
  int iVar1;
  ScriptPubKeyMan *pSVar2;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  OutputType t;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  OutputType local_4c;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  if ((this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    lVar3 = 0;
    do {
      local_4c = *(OutputType *)((long)OUTPUT_TYPES._M_elems + lVar3);
      pSVar2 = GetScriptPubKeyMan(this,&local_4c,internal);
      if ((pSVar2 != (ScriptPubKeyMan *)0x0) &&
         (iVar1 = (*pSVar2->_vptr_ScriptPubKeyMan[0xd])(pSVar2,(ulong)internal), (char)iVar1 != '\0'
         )) break;
      lVar3 = lVar3 + 4;
      bVar4 = lVar3 != 0x10;
    } while (bVar4);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CWallet::CanGetAddresses(bool internal) const
{
    LOCK(cs_wallet);
    if (m_spk_managers.empty()) return false;
    for (OutputType t : OUTPUT_TYPES) {
        auto spk_man = GetScriptPubKeyMan(t, internal);
        if (spk_man && spk_man->CanGetAddresses(internal)) {
            return true;
        }
    }
    return false;
}